

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O3

CURLcode Curl_rtsp_parseheader(Curl_easy *data,char *header)

{
  uchar *puVar1;
  FILEPROTO *pFVar2;
  curl_trc_feat *pcVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  size_t length;
  char *pcVar10;
  curl_off_t CSeq;
  char *p;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  iVar5 = curl_strnequal(header,"CSeq:",5);
  if (iVar5 == 0) {
    iVar5 = curl_strnequal(header,"Session:",8);
    if (iVar5 == 0) {
      iVar5 = curl_strnequal(header,"Transport:",10);
      if (iVar5 == 0) {
        return CURLE_OK;
      }
      pcVar8 = header + 10;
      local_50 = pcVar8;
      while( true ) {
        if (*local_50 == '\0') {
          return CURLE_OK;
        }
        Curl_str_passblanks(&local_50);
        pcVar10 = local_50;
        pcVar7 = strchr(local_50,0x3b);
        iVar5 = curl_strnequal(pcVar10,"interleaved=",0xc);
        if (iVar5 != 0) break;
        local_50 = pcVar7 + 1;
        if (pcVar7 == (char *)0x0) {
          return CURLE_OK;
        }
      }
      local_40 = local_50 + 0xc;
      iVar5 = Curl_str_number(&local_40,(curl_off_t *)&local_48,0xff);
      pcVar10 = local_48;
      if (iVar5 != 0) {
        if (data == (Curl_easy *)0x0) {
          return CURLE_OK;
        }
        if (((data->set).field_0x89f & 0x40) == 0) {
          return CURLE_OK;
        }
        pcVar3 = (data->state).feat;
        if ((pcVar3 != (curl_trc_feat *)0x0) && (pcVar3->log_level < 1)) {
          return CURLE_OK;
        }
        Curl_infof(data,"Unable to read the interleaved parameter from Transport header: [%s]",
                   pcVar8);
        return CURLE_OK;
      }
      local_38 = local_48;
      iVar5 = Curl_str_single(&local_40,'-');
      if (((((iVar5 == 0) &&
            (iVar5 = Curl_str_number(&local_40,(curl_off_t *)&local_38,0xff), pcVar10 = local_38,
            iVar5 != 0)) && (pcVar10 = local_48, data != (Curl_easy *)0x0)) &&
          (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
      {
        Curl_infof(data,"Unable to read the interleaved parameter from Transport header: [%s]",
                   pcVar8);
        pcVar10 = local_48;
      }
      if ((long)pcVar10 < (long)local_48) {
        return CURLE_OK;
      }
      do {
        iVar5 = (int)local_48;
        iVar9 = iVar5 + 7;
        if (-1 < iVar5) {
          iVar9 = iVar5;
        }
        puVar1 = (data->state).rtp_channel_mask + (iVar9 >> 3);
        *puVar1 = *puVar1 | (byte)(1 << ((byte)local_48 & 7));
        local_48 = local_48 + 1;
      } while (pcVar10 + 1 != local_48);
      return CURLE_OK;
    }
    local_50 = header + 8;
    Curl_str_passblanks(&local_50);
    pcVar8 = local_50;
    if (*local_50 == '\0') {
      Curl_failf(data,"Got a blank Session ID");
      return CURLE_RTSP_SESSION_ERROR;
    }
    length = 0xffffffffffffffff;
    do {
      lVar4 = length + 1;
      length = length + 1;
      if (local_50[lVar4] < '!') break;
    } while (local_50[lVar4] != ';');
    pcVar10 = (data->set).str[0x33];
    if (pcVar10 == (char *)0x0) {
      pcVar8 = (char *)Curl_memdup0(local_50,length);
      (data->set).str[0x33] = pcVar8;
      if (pcVar8 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    else {
      sVar6 = strlen(pcVar10);
      if ((sVar6 != length) || (iVar5 = strncmp(pcVar8,pcVar10,length), iVar5 != 0)) {
        Curl_failf(data,"Got RTSP Session ID Line [%s], but wanted ID [%s]",pcVar8,pcVar10);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
  }
  else {
    local_50 = (char *)0x0;
    pFVar2 = (data->req).p.file;
    local_48 = header + 5;
    Curl_str_passblanks(&local_48);
    iVar5 = Curl_str_number(&local_48,(curl_off_t *)&local_50,0x7fffffffffffffff);
    if (iVar5 != 0) {
      Curl_failf(data,"Unable to read the CSeq header: [%s]",header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
    pFVar2->freepath = local_50;
    (data->state).rtsp_CSeq_recv = (long)local_50;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_rtsp_parseheader(struct Curl_easy *data, const char *header)
{
  if(checkprefix("CSeq:", header)) {
    curl_off_t CSeq = 0;
    struct RTSP *rtsp = data->req.p.rtsp;
    const char *p = &header[5];
    Curl_str_passblanks(&p);
    if(Curl_str_number(&p, &CSeq, LONG_MAX)) {
      failf(data, "Unable to read the CSeq header: [%s]", header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
    rtsp->CSeq_recv = (long)CSeq; /* mark the request */
    data->state.rtsp_CSeq_recv = (long)CSeq; /* update the handle */
  }
  else if(checkprefix("Session:", header)) {
    const char *start, *end;
    size_t idlen;

    /* Find the first non-space letter */
    start = header + 8;
    Curl_str_passblanks(&start);

    if(!*start) {
      failf(data, "Got a blank Session ID");
      return CURLE_RTSP_SESSION_ERROR;
    }

    /* Find the end of Session ID
     *
     * Allow any non whitespace content, up to the field separator or end of
     * line. RFC 2326 is not 100% clear on the session ID and for example
     * gstreamer does url-encoded session ID's not covered by the standard.
     */
    end = start;
    while((*end > ' ') && (*end != ';'))
      end++;
    idlen = end - start;

    if(data->set.str[STRING_RTSP_SESSION_ID]) {

      /* If the Session ID is set, then compare */
      if(strlen(data->set.str[STRING_RTSP_SESSION_ID]) != idlen ||
         strncmp(start, data->set.str[STRING_RTSP_SESSION_ID], idlen)) {
        failf(data, "Got RTSP Session ID Line [%s], but wanted ID [%s]",
              start, data->set.str[STRING_RTSP_SESSION_ID]);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
    else {
      /* If the Session ID is not set, and we find it in a response, then set
       * it.
       */

      /* Copy the id substring into a new buffer */
      data->set.str[STRING_RTSP_SESSION_ID] = Curl_memdup0(start, idlen);
      if(!data->set.str[STRING_RTSP_SESSION_ID])
        return CURLE_OUT_OF_MEMORY;
    }
  }
  else if(checkprefix("Transport:", header)) {
    CURLcode result;
    result = rtsp_parse_transport(data, header + 10);
    if(result)
      return result;
  }
  return CURLE_OK;
}